

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_infill_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float *pfVar1;
  float fVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  llama_token lVar6;
  undefined8 *puVar7;
  long lVar8;
  char *__s2;
  undefined8 *puVar9;
  long *in_RSI;
  long in_RDI;
  undefined1 auVar10 [16];
  size_t i_7;
  bool is_eog_1;
  size_t i_6;
  size_t i_5;
  bool is_eog;
  size_t i_4;
  float thold;
  float p_sum;
  size_t size_org;
  size_t n_non_eog;
  int src;
  int dst;
  int len1;
  int len0;
  size_t i1;
  size_t i0;
  size_t n_combined;
  size_t i_3;
  size_t i_2;
  float p_sum_1;
  size_t size_org_1;
  float rat;
  size_t i_1;
  float p_eog_sum;
  float p_txt_sum;
  size_t i;
  llama_sampler_infill *ctx;
  int32_t in_stack_fffffffffffffeb8;
  llama_token in_stack_fffffffffffffebc;
  llama_vocab *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  llama_token_data_array *in_stack_fffffffffffffee0;
  float local_d0;
  float local_cc;
  ulong local_c8;
  ulong local_b8;
  ulong local_b0;
  ulong local_a0;
  float local_94;
  long local_88;
  int local_80;
  int local_7c;
  int32_t local_78;
  int32_t local_74;
  ulong local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  float local_44;
  ulong local_40;
  float local_34;
  ulong local_30;
  float local_28;
  float local_24;
  ulong local_20;
  undefined8 *local_18;
  long *local_10;
  
  local_18 = *(undefined8 **)(in_RDI + 8);
  local_10 = in_RSI;
  llama_sampler_softmax_impl(in_stack_fffffffffffffee0);
  for (local_20 = 0; local_20 < (ulong)local_10[1]; local_20 = local_20 + 1) {
  }
  local_24 = 0.0;
  local_28 = 0.0;
  for (local_30 = 0; local_30 < (ulong)local_10[1]; local_30 = local_30 + 1) {
    bVar4 = llama_vocab::is_eog(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    if (bVar4) {
      local_28 = *(float *)(*local_10 + local_30 * 0xc + 8) + local_28;
    }
    else {
      local_24 = *(float *)(*local_10 + local_30 * 0xc + 8) + local_24;
    }
  }
  if ((local_28 != 0.0) || (NAN(local_28))) {
    local_cc = local_24 / local_28;
  }
  else {
    local_cc = INFINITY;
  }
  local_34 = local_cc;
  local_d0 = (float)(ulong)local_10[1];
  if (local_28 * 3.0 * local_d0 <= local_24) {
    local_60 = 0;
    for (local_68 = 0; local_68 < (ulong)local_10[1]; local_68 = local_68 + 1) {
      local_70 = 0;
      while ((local_70 < (ulong)local_10[1] &&
             ((fVar2 = *(float *)(*local_10 + local_68 * 0xc + 4), fVar2 != -INFINITY ||
              (NAN(fVar2)))))) {
        if ((local_68 != local_70) &&
           ((fVar2 = *(float *)(*local_10 + local_70 * 0xc + 4), fVar2 != -INFINITY || (NAN(fVar2)))
           )) {
          std::vector<char,_std::allocator<char>_>::data
                    ((vector<char,_std::allocator<char>_> *)0x52228e);
          std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)(local_18 + 1));
          local_74 = llama_vocab::token_to_piece
                               ((llama_vocab *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                (llama_token)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                                (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                                in_stack_fffffffffffffeb8,false);
          if (local_74 < 0) {
            std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffee0,
                       (size_type)in_stack_fffffffffffffed8);
            std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)0x52232b);
            std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)(local_18 + 1));
            local_74 = llama_vocab::token_to_piece
                                 ((llama_vocab *)
                                  CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                  (llama_token)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                                  (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                                  in_stack_fffffffffffffeb8,false);
          }
          in_stack_fffffffffffffee0 = (llama_token_data_array *)*local_18;
          std::vector<char,_std::allocator<char>_>::data
                    ((vector<char,_std::allocator<char>_> *)0x5223a1);
          std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)(local_18 + 4));
          local_78 = llama_vocab::token_to_piece
                               ((llama_vocab *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                (llama_token)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                                (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                                in_stack_fffffffffffffeb8,false);
          if (local_78 < 0) {
            std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffee0,
                       (size_type)in_stack_fffffffffffffed8);
            in_stack_fffffffffffffec8 = *local_18;
            in_stack_fffffffffffffed4 = *(undefined4 *)(*local_10 + local_70 * 0xc);
            in_stack_fffffffffffffed8 =
                 std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x52243e);
            std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)(local_18 + 4));
            local_78 = llama_vocab::token_to_piece
                                 ((llama_vocab *)
                                  CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                  (llama_token)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                                  (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                                  in_stack_fffffffffffffeb8,false);
          }
          if ((0 < local_74) && (local_74 <= local_78)) {
            in_stack_fffffffffffffec0 =
                 (llama_vocab *)
                 std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x5224a9);
            __s2 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x5224bf);
            iVar5 = memcmp(in_stack_fffffffffffffec0,__s2,(long)local_74);
            if (iVar5 == 0) {
              local_7c = (int)local_68;
              local_80 = (int)local_70;
              fVar2 = *(float *)(*local_10 + local_70 * 0xc + 8);
              pfVar1 = (float *)(*local_10 + local_68 * 0xc + 8);
              if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
                std::swap<int>(&local_7c,&local_80);
              }
              lVar8 = *local_10 + (long)local_7c * 0xc;
              *(float *)(lVar8 + 8) =
                   *(float *)(*local_10 + (long)local_80 * 0xc + 8) + *(float *)(lVar8 + 8);
              *(undefined4 *)(*local_10 + (long)local_80 * 0xc + 4) = 0xff800000;
              *(undefined4 *)(*local_10 + (long)local_80 * 0xc + 8) = 0;
              local_60 = local_60 + 1;
            }
          }
        }
        local_70 = local_70 + 1;
      }
    }
    local_88 = 0;
    uVar3 = local_10[1];
    local_94 = 0.0;
    local_10[1] = 0;
    for (local_a0 = 0; local_a0 < uVar3; local_a0 = local_a0 + 1) {
      bVar4 = llama_vocab::is_eog(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      if ((0.2 <= *(float *)(*local_10 + local_a0 * 0xc + 8)) || (bVar4)) {
        if (!bVar4) {
          local_88 = local_88 + 1;
        }
        local_94 = *(float *)(*local_10 + local_a0 * 0xc + 8) + local_94;
        puVar9 = (undefined8 *)(*local_10 + local_a0 * 0xc);
        lVar8 = local_10[1];
        local_10[1] = lVar8 + 1;
        puVar7 = (undefined8 *)(*local_10 + lVar8 * 0xc);
        *puVar7 = *puVar9;
        *(undefined4 *)(puVar7 + 1) = *(undefined4 *)(puVar9 + 1);
      }
    }
    if (local_88 == 0) {
      local_10[1] = 1;
      lVar6 = llama_vocab::token_eot((llama_vocab *)0x5227d5);
      *(llama_token *)*local_10 = lVar6;
      *(undefined4 *)(*local_10 + 4) = 0x3f800000;
    }
    else {
      for (local_b0 = 0; local_b0 < (ulong)local_10[1]; local_b0 = local_b0 + 1) {
        lVar8 = *local_10 + local_b0 * 0xc;
        *(float *)(lVar8 + 8) = *(float *)(lVar8 + 8) / local_94;
      }
      uVar3 = local_10[1];
      local_94 = 0.0;
      local_88 = local_88 + 1;
      auVar10._8_4_ = (int)((ulong)local_88 >> 0x20);
      auVar10._0_8_ = local_88;
      auVar10._12_4_ = 0x45300000;
      local_10[1] = 0;
      for (local_b8 = 0; local_b8 < uVar3; local_b8 = local_b8 + 1) {
        bVar4 = llama_vocab::is_eog(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        if (((float)(1.0 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_88) - 4503599627370496.0))) <=
             *(float *)(*local_10 + local_b8 * 0xc + 8)) || (bVar4)) {
          local_94 = *(float *)(*local_10 + local_b8 * 0xc + 8) + local_94;
          puVar9 = (undefined8 *)(*local_10 + local_b8 * 0xc);
          lVar8 = local_10[1];
          local_10[1] = lVar8 + 1;
          puVar7 = (undefined8 *)(*local_10 + lVar8 * 0xc);
          *puVar7 = *puVar9;
          *(undefined4 *)(puVar7 + 1) = *(undefined4 *)(puVar9 + 1);
        }
      }
      for (local_c8 = 0; local_c8 < (ulong)local_10[1]; local_c8 = local_c8 + 1) {
        lVar8 = *local_10 + local_c8 * 0xc;
        *(float *)(lVar8 + 8) = *(float *)(lVar8 + 8) / local_94;
      }
    }
  }
  else {
    local_40 = local_10[1];
    local_10[1] = 0;
    local_44 = 0.0;
    for (local_50 = 0; local_50 < local_40; local_50 = local_50 + 1) {
      bVar4 = llama_vocab::is_eog(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      if (bVar4) {
        local_44 = *(float *)(*local_10 + local_50 * 0xc + 8) + local_44;
        puVar9 = (undefined8 *)(*local_10 + local_50 * 0xc);
        lVar8 = local_10[1];
        local_10[1] = lVar8 + 1;
        puVar7 = (undefined8 *)(*local_10 + lVar8 * 0xc);
        *puVar7 = *puVar9;
        *(undefined4 *)(puVar7 + 1) = *(undefined4 *)(puVar9 + 1);
      }
    }
    for (local_58 = 0; local_58 < (ulong)local_10[1]; local_58 = local_58 + 1) {
      lVar8 = *local_10 + local_58 * 0xc;
      *(float *)(lVar8 + 8) = *(float *)(lVar8 + 8) / local_44;
    }
  }
  return;
}

Assistant:

static void llama_sampler_infill_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_infill *) smpl->ctx;

    llama_sampler_softmax_impl(cur_p);

#if defined(GGML_DEBUG_SAMPLER_INFILL)
#define LOG_DBG_CUR LLAMA_LOG_DEBUG
#else
#define LOG_DBG_CUR(...)
#endif

    for (size_t i = 0; i < cur_p->size; ++i) {
        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

    float p_txt_sum = 0.0f;
    float p_eog_sum = 0.0f;

    for (size_t i = 0; i < cur_p->size; ++i) {
        if (ctx->vocab->is_eog(cur_p->data[i].id)) {
            p_eog_sum += cur_p->data[i].p;
        } else {
            p_txt_sum += cur_p->data[i].p;
        }
    }

    const float rat = p_eog_sum == 0.0 ? INFINITY : p_txt_sum / p_eog_sum; GGML_UNUSED(rat);

    LOG_DBG_CUR("%s: p_txt_sum = %.2f, p_eog_sum = %.2f, rat = %.2f, n = %zu\n", __func__, p_txt_sum, p_eog_sum, rat, cur_p->size);

    if (3*p_eog_sum*cur_p->size > p_txt_sum) {
        LOG_DBG_CUR("%s: the ratio p_txt/p_eog = %.2f is too low -> sampling EOG\n", __func__, p_txt_sum/p_eog_sum);

        // keep just the EOG tokens
        const auto size_org = cur_p->size;

        cur_p->size = 0;

        float p_sum = 0.0f;

        for (size_t i = 0; i < size_org; ++i) {
            if (ctx->vocab->is_eog(cur_p->data[i].id)) {
                p_sum += cur_p->data[i].p;

                cur_p->data[cur_p->size++] = cur_p->data[i];
            }
        }

        // normalize probs
        for (size_t i = 0; i < cur_p->size; ++i) {
            cur_p->data[i].p /= p_sum;
        }

        return;
    }

    size_t n_combined = 0; GGML_UNUSED(n_combined);

    // combine tokens with common prefix
    for (size_t i0 = 0; i0 < cur_p->size; ++i0) {
        for (size_t i1 = 0; i1 < cur_p->size; ++i1) {
            if (cur_p->data[i0].logit == -INFINITY) {
                break;
            }

            if (i0 == i1 || cur_p->data[i1].logit == -INFINITY) {
                continue;
            }

            int len0 = ctx->vocab->token_to_piece(cur_p->data[i0].id, ctx->buf0.data(), ctx->buf0.size(), 0, false);
            if (len0 < 0) {
                ctx->buf0.resize(len0);
                len0 = ctx->vocab->token_to_piece(cur_p->data[i0].id, ctx->buf0.data(), ctx->buf0.size(), 0, false);
                assert(len0 > 0);
            }

            int len1 = ctx->vocab->token_to_piece(cur_p->data[i1].id, ctx->buf1.data(), ctx->buf1.size(), 0, false);
            if (len1 < 0) {
                ctx->buf1.resize(len1);
                len1 = ctx->vocab->token_to_piece(cur_p->data[i1].id, ctx->buf1.data(), ctx->buf1.size(), 0, false);
                assert(len1 > 0);
            }

            // token i0 is a prefix of token i1
            if (len0 > 0 && len0 <= len1 && memcmp(ctx->buf0.data(), ctx->buf1.data(), len0) == 0) {
                int dst = i0;
                int src = i1;

                // merge into the token with higher probability
                if (cur_p->data[i1].p > cur_p->data[i0].p) {
                    std::swap(dst, src);
                }

                cur_p->data[dst].p += cur_p->data[src].p;
                cur_p->data[src].logit = -INFINITY;
                cur_p->data[src].p     = 0.0f;

                n_combined++;
            }
        }
    }

    size_t n_non_eog = 0;

    size_t size_org = cur_p->size;

    float p_sum = 0.0f;
    float thold = 0.2f;

    cur_p->size = 0;

    LOG_DBG_CUR("%s: n_combined = %zu, applying thold = %.3f\n", __func__, n_combined, thold);

    for (size_t i = 0; i < size_org; ++i) {
        const bool is_eog = ctx->vocab->is_eog(cur_p->data[i].id);

        if (cur_p->data[i].p < thold && !is_eog) {
            continue;
        }

        if (!is_eog) {
            ++n_non_eog;
        }

        p_sum += cur_p->data[i].p;

        // keep this token
        cur_p->data[cur_p->size++] = cur_p->data[i];
    }

    LOG_DBG_CUR("%s: n_non_eog = %zu\n", __func__, n_non_eog);

    // if no non-EOG tokens are left -> reduce cur_p to single EOT token
    if (n_non_eog == 0) {
        cur_p->size = 1;
        cur_p->data[0].id = ctx->vocab->token_eot();
        cur_p->data[0].logit = 1.0f;

        return;
    }

    // normalize probs
    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= p_sum;

        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

    size_org = cur_p->size;
    p_sum = 0.0f;
    thold = 1.0/(n_non_eog + 1);

    cur_p->size = 0;

    LOG_DBG_CUR("%s: applying thold = %.3f\n", __func__, thold);

    for (size_t i = 0; i < size_org; ++i) {
        const bool is_eog = ctx->vocab->is_eog(cur_p->data[i].id);

        if (cur_p->data[i].p < thold && !is_eog) {
            continue;
        }

        p_sum += cur_p->data[i].p;

        cur_p->data[cur_p->size++] = cur_p->data[i];
    }

    // normalize probs
    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= p_sum;

        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

#undef LOG_DBG_CUR
}